

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O1

Configuration * __thiscall
TagConfiguration::configuration(Configuration *__return_storage_ptr__,TagConfiguration *this)

{
  pointer psVar1;
  pointer psVar2;
  Pair local_58;
  
  (__return_storage_ptr__->m_stringValue)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_stringValue).field_2;
  (__return_storage_ptr__->m_stringValue)._M_string_length = 0;
  (__return_storage_ptr__->m_stringValue).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->m_vectorOfTags).
  super__Vector_base<Configuration::Pair,_std::allocator<Configuration::Pair>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_vectorOfTags).
  super__Vector_base<Configuration::Pair,_std::allocator<Configuration::Pair>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_vectorOfTags).
  super__Vector_base<Configuration::Pair,_std::allocator<Configuration::Pair>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_listOfStringValues).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_listOfStringValues).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->m_listOfStringValues).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->m_listOfStringValues).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->m_listOfStringValues,&(this->m_listOfStringValues).m_values);
  __return_storage_ptr__->m_intValue = (this->m_intValue).m_value;
  psVar2 = (this->m_vecOfTags).m_tags.
           super__Vector_base<std::shared_ptr<TagVecOfTags>,_std::allocator<std::shared_ptr<TagVecOfTags>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_vecOfTags).m_tags.
           super__Vector_base<std::shared_ptr<TagVecOfTags>,_std::allocator<std::shared_ptr<TagVecOfTags>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 != psVar1) {
    do {
      TagVecOfTags::pair(&local_58,
                         (psVar2->super___shared_ptr<TagVecOfTags,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
      std::vector<Configuration::Pair,_std::allocator<Configuration::Pair>_>::
      emplace_back<Configuration::Pair>(&__return_storage_ptr__->m_vectorOfTags,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.m_stringValue._M_dataplus._M_p != &local_58.m_stringValue.field_2) {
        operator_delete(local_58.m_stringValue._M_dataplus._M_p,
                        local_58.m_stringValue.field_2._M_allocated_capacity + 1);
      }
      psVar2 = psVar2 + 1;
    } while (psVar2 != psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Configuration
TagConfiguration::configuration() const
{
	Configuration cfg;

	cfg.m_stringValue = m_stringValue.value();
	cfg.m_listOfStringValues = m_listOfStringValues.values();
	cfg.m_intValue = m_intValue.value();

	for( auto & p : m_vecOfTags.values() )
		cfg.m_vectorOfTags.push_back( p->pair() );

	return cfg;
}